

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::getLeftmost(Earcut<unsigned_int> *this,Node *start)

{
  Node *leftmost;
  Node *p;
  Node *start_local;
  Earcut<unsigned_int> *this_local;
  
  leftmost = start;
  p = start;
  do {
    if ((p->x < leftmost->x) ||
       (((p->x == leftmost->x && (!NAN(p->x) && !NAN(leftmost->x))) && (p->y < leftmost->y)))) {
      leftmost = p;
    }
    p = p->next;
  } while (p != start);
  return leftmost;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::getLeftmost(Node* start) {
    Node* p = start;
    Node* leftmost = start;
    do {
        if (p->x < leftmost->x || (p->x == leftmost->x && p->y < leftmost->y))
            leftmost = p;
        p = p->next;
    } while (p != start);

    return leftmost;
}